

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrmem.c
# Opt level: O1

int mem_create(char *filename,int *handle)

{
  int iVar1;
  
  iVar1 = mem_createmem(0xb40,handle);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    ffpmsg("failed to create empty memory file (mem_create)");
  }
  return iVar1;
}

Assistant:

int mem_create(char *filename, int *handle)
/*
  Create a new empty memory file for subsequent writes.
  The file name is ignored in this case.
*/
{
    int status;

    /* initially allocate 1 FITS block = 2880 bytes */
    status = mem_createmem(2880L, handle);

    if (status)
    {
        ffpmsg("failed to create empty memory file (mem_create)");
        return(status);
    }

    return(0);
}